

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

char * __thiscall Fl_Text_Buffer::selection_text_(Fl_Text_Buffer *this,Fl_Text_Selection *sel)

{
  int iVar1;
  char *s;
  int end;
  int start;
  Fl_Text_Selection *sel_local;
  Fl_Text_Buffer *this_local;
  
  _end = sel;
  sel_local = (Fl_Text_Selection *)this;
  iVar1 = Fl_Text_Selection::position(sel,(int *)((long)&s + 4),(int *)&s);
  if (iVar1 == 0) {
    this_local = (Fl_Text_Buffer *)malloc(1);
    *(undefined1 *)&this_local->input_file_was_transcoded = 0;
  }
  else {
    this_local = (Fl_Text_Buffer *)text_range(this,s._4_4_,(int)s);
  }
  return (char *)this_local;
}

Assistant:

char *Fl_Text_Buffer::selection_text_(Fl_Text_Selection * sel) const {
  int start, end;
  
  /* If there's no selection, return an allocated empty string */
  if (!sel->position(&start, &end))
  {
    char *s = (char *) malloc(1);
    *s = '\0';
    return s;
  }
  
  /* Return the selected range */
    return text_range(start, end);
}